

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O3

sparse_bit_array * __thiscall
crnlib::sparse_bit_array::operator=(sparse_bit_array *this,sparse_bit_array *other)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  uint32 **ppuVar10;
  uint32 *puVar11;
  ulong uVar12;
  uint32 *p;
  
  if (this != other) {
    uVar9 = this->m_num_groups;
    if (uVar9 != other->m_num_groups) {
      clear(this);
      uVar1 = other->m_num_groups;
      this->m_num_groups = uVar1;
      ppuVar10 = (uint32 **)crnlib_calloc((ulong)uVar1,8,(size_t *)0x0);
      this->m_ppGroups = ppuVar10;
      if (ppuVar10 == (uint32 **)0x0) {
        crnlib_assert("m_ppGroups",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.cpp"
                      ,0x50);
      }
      uVar9 = this->m_num_groups;
    }
    if (uVar9 != 0) {
      uVar12 = 0;
      do {
        puVar11 = other->m_ppGroups[uVar12];
        p = this->m_ppGroups[uVar12];
        if (puVar11 == (uint32 *)0x0) {
          if (p != (uint32 *)0x0) {
            crnlib_free(p);
            this->m_ppGroups[uVar12] = (uint32 *)0x0;
          }
        }
        else {
          if (p == (uint32 *)0x0) {
            puVar11 = (uint32 *)crnlib_malloc(0x40);
            if (puVar11 == (uint32 *)0x0) {
              crnlib_assert("p",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.h"
                            ,199);
            }
            this->m_ppGroups[uVar12] = puVar11;
            p = this->m_ppGroups[uVar12];
            puVar11 = other->m_ppGroups[uVar12];
          }
          uVar2 = *(undefined8 *)puVar11;
          uVar3 = *(undefined8 *)(puVar11 + 2);
          uVar4 = *(undefined8 *)(puVar11 + 4);
          uVar5 = *(undefined8 *)(puVar11 + 6);
          uVar6 = *(undefined8 *)(puVar11 + 8);
          uVar7 = *(undefined8 *)(puVar11 + 10);
          uVar8 = *(undefined8 *)(puVar11 + 0xe);
          *(undefined8 *)(p + 0xc) = *(undefined8 *)(puVar11 + 0xc);
          *(undefined8 *)(p + 0xe) = uVar8;
          *(undefined8 *)(p + 8) = uVar6;
          *(undefined8 *)(p + 10) = uVar7;
          *(undefined8 *)(p + 4) = uVar4;
          *(undefined8 *)(p + 6) = uVar5;
          *(undefined8 *)p = uVar2;
          *(undefined8 *)(p + 2) = uVar3;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < this->m_num_groups);
    }
  }
  return this;
}

Assistant:

sparse_bit_array& sparse_bit_array::operator=(sparse_bit_array& other)
    {
        if (this == &other)
        {
            return *this;
        }

        if (m_num_groups != other.m_num_groups)
        {
            clear();

            m_num_groups = other.m_num_groups;
            m_ppGroups = (uint32**)crnlib_calloc(m_num_groups, sizeof(uint32*));
            CRNLIB_VERIFY(m_ppGroups);
        }

        for (uint i = 0; i < m_num_groups; i++)
        {
            if (other.m_ppGroups[i])
            {
                if (!m_ppGroups[i])
                {
                    m_ppGroups[i] = alloc_group(false);
                }
                memcpy(m_ppGroups[i], other.m_ppGroups[i], cBytesPerGroup);
            }
            else if (m_ppGroups[i])
            {
                free_group(m_ppGroups[i]);
                m_ppGroups[i] = nullptr;
            }
        }

        return *this;
    }